

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileSuffixRead(octet *suffix,size_t *count,char *name,size_t offset)

{
  bool_t bVar1;
  file_t pFVar2;
  u32 *tag_00;
  size_t *len_00;
  file_t pFVar3;
  size_t sVar4;
  blob_t buf_00;
  void *pvVar5;
  u32 *in_RCX;
  ulong *in_RSI;
  long in_RDI;
  size_t len;
  u32 tag;
  size_t c;
  void *buf;
  size_t size;
  file_t file;
  err_t code;
  size_t buf_size;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  file_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  file_t der;
  void *buf_01;
  err_t local_34;
  err_t local_4;
  
  pFVar2 = fileOpen(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_34 = 0xcb;
  if (pFVar2 != (file_t)0x0) {
    local_34 = 0;
  }
  local_4 = local_34;
  if (local_34 == 0) {
    tag_00 = (u32 *)fileSize(in_stack_ffffffffffffff98);
    if (tag_00 == (u32 *)0xffffffffffffffff) {
      local_34 = 0xcf;
    }
    else if (tag_00 <= in_RCX) {
      local_34 = 0xd1;
    }
    if (local_34 == 0) {
      len_00 = (size_t *)blobCreate((size_t)in_stack_ffffffffffffff88);
      local_34 = 0x6e;
      if (len_00 != (size_t *)0x0) {
        local_34 = 0;
      }
      if (local_34 == 0) {
        if ((ulong)((long)tag_00 - (long)in_RCX) < 0x11) {
          pFVar2 = (file_t)((long)tag_00 - (long)in_RCX);
        }
        else {
          pFVar2 = (file_t)&DAT_00000010;
        }
        der = pFVar2;
        bVar1 = fileSeek(pFVar2,(size_t)in_stack_ffffffffffffff88,0);
        if ((bVar1 == 0) ||
           (pFVar3 = (file_t)fileRead2(der,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
           pFVar3 != der)) {
          local_34 = 0xcf;
        }
        if (local_34 == 0) {
          memRev(len_00,(size_t)der);
          sVar4 = derTLDec(tag_00,len_00,(octet *)der,in_stack_ffffffffffffffa0);
          if ((sVar4 == 0xffffffffffffffff) ||
             (tag_00 < (u32 *)((long)in_RCX + (long)&in_stack_ffffffffffffff98->_flags + sVar4))) {
            local_34 = 0x132;
          }
          if (local_34 == 0) {
            buf_01 = (void *)((long)&in_stack_ffffffffffffff98->_flags + sVar4);
            blobClose((blob_t)0x1063ed);
            buf_00 = blobCreate((size_t)in_stack_ffffffffffffff88);
            local_34 = 0x6e;
            if (buf_00 != (blob_t)0x0) {
              local_34 = 0;
            }
            if (local_34 == 0) {
              bVar1 = fileSeek(pFVar2,(size_t)in_stack_ffffffffffffff88,0);
              if ((bVar1 == 0) ||
                 (pvVar5 = (void *)fileRead2(buf_01,in_stack_ffffffffffffffa0,
                                             in_stack_ffffffffffffff98), pvVar5 != buf_01)) {
                local_34 = 0xcf;
              }
              if (local_34 == 0) {
                bVar1 = fileClose((file_t)0x1064a4);
                local_34 = 0x67;
                if (bVar1 != 0) {
                  local_34 = 0;
                }
                if (local_34 == 0) {
                  memRev(buf_00,(size_t)buf_01);
                  bVar1 = derIsValid3((octet *)pFVar2,(size_t)in_stack_ffffffffffffff88);
                  if (bVar1 == 0) {
                    local_34 = 0x132;
                  }
                  if (local_34 == 0) {
                    memRev(buf_00,(size_t)buf_01);
                    if (in_RDI != 0) {
                      if ((void *)*in_RSI < buf_01) {
                        local_34 = 0x6e;
                      }
                      else {
                        memCopy(pFVar2,in_stack_ffffffffffffff88,0x10655f);
                      }
                    }
                    *in_RSI = (ulong)buf_01;
                    blobClose((blob_t)0x106578);
                    local_4 = local_34;
                  }
                  else {
                    blobClose((blob_t)0x106511);
                    local_4 = local_34;
                  }
                }
                else {
                  blobClose((blob_t)0x1064c8);
                  local_4 = local_34;
                }
              }
              else {
                blobClose((blob_t)0x106483);
                fileClose((file_t)0x10648d);
                local_4 = local_34;
              }
            }
            else {
              fileClose((file_t)0x106422);
              local_4 = local_34;
            }
          }
          else {
            blobClose((blob_t)0x1063bd);
            fileClose((file_t)0x1063c7);
            local_4 = local_34;
          }
        }
        else {
          blobClose((blob_t)0x106342);
          fileClose((file_t)0x10634c);
          local_4 = local_34;
        }
      }
      else {
        fileClose((file_t)0x1062a8);
        local_4 = local_34;
      }
    }
    else {
      fileClose((file_t)0x106266);
      local_4 = local_34;
    }
  }
  return local_4;
}

Assistant:

err_t cmdFileSuffixRead(octet* suffix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок суффикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// развернуть суффикс
	memRev(buf, c);
	// определить длину суффикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать суффикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить суффикс
	memRev(buf, c);
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	memRev(buf, c);
	// возвратить суффикс и его длину
	if (suffix)
	{
		ASSERT(memIsValid(suffix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(suffix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}